

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O1

pair<polyscope::Structure_*,_unsigned_long> polyscope::pick::evaluatePickQuery(int xPos,int yPos)

{
  long *plVar1;
  double dVar2;
  ulong uVar3;
  char cVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  long lVar8;
  undefined8 *puVar9;
  unsigned_long uVar10;
  long lVar11;
  ulong uVar12;
  Structure *pSVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 in_XMM4 [16];
  pair<polyscope::Structure_*,_unsigned_long> pVar18;
  undefined1 auVar19 [12];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
  x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
  cat;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  long *local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
  local_80;
  undefined1 extraout_var [56];
  
  uVar10 = 0;
  pSVar13 = (Structure *)0x0;
  if (-2 < xPos) {
    pSVar13 = (Structure *)0x0;
    if ((yPos < -1) || (view::bufferWidth <= xPos)) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      pSVar13 = (Structure *)0x0;
      if (yPos < view::bufferHeight) {
        plVar1 = (long *)render::engine[0x1e];
        pSVar13 = (Structure *)0x0;
        (**(code **)(*render::engine + 0x50))(render::engine,0);
        (**(code **)(*render::engine + 0x58))(render::engine,7);
        (**(code **)(*plVar1 + 0x58))(plVar1,view::bufferWidth,view::bufferHeight);
        (**(code **)(*plVar1 + 0x50))(plVar1,0,0,view::bufferWidth,view::bufferHeight);
        plVar1[1] = 0;
        *(undefined4 *)(plVar1 + 2) = 0;
        cVar4 = (**(code **)(*plVar1 + 0x18))(plVar1);
        uVar10 = 0;
        if (cVar4 != '\0') {
          (**(code **)(*plVar1 + 0x20))(plVar1);
          if (state::structures_abi_cxx11_._24_8_ != 0x4bddb8) {
            p_Var6 = (_Rb_tree_node_base *)state::structures_abi_cxx11_._24_8_;
            do {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
              ::pair(&local_80,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
                      *)(p_Var6 + 1));
              for (p_Var5 = local_80.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var5 != &local_80.second._M_t._M_impl.super__Rb_tree_header;
                  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                local_a8[0] = local_98;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_a8,*(long *)(p_Var5 + 1),
                           (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
                local_88 = *(long **)(p_Var5 + 2);
                (**(code **)(*local_88 + 0x18))();
                if (local_a8[0] != local_98) {
                  operator_delete(local_a8[0]);
                }
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>
              ::~_Rb_tree(&local_80.second._M_t);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
                operator_delete(local_80.first._M_dataplus._M_p);
              }
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            } while (p_Var6 != (_Rb_tree_node_base *)(state::structures_abi_cxx11_ + 8));
          }
          pSVar13 = (Structure *)0x0;
          uVar10 = 0;
          if (yPos != -1 && xPos != -1) {
            auVar19 = (**(code **)(*plVar1 + 0x60))(plVar1,xPos,view::bufferHeight - yPos);
            auVar17._0_8_ = auVar19._0_8_;
            auVar17._8_56_ = extraout_var;
            dVar2 = (double)auVar19._8_4_ * 4194304.0;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = dVar2;
            lVar8 = vcvttsd2usi_avx512f(auVar14);
            auVar14 = vcvtps2pd_avx(auVar17._0_16_);
            auVar15._8_8_ = 0x4150000000000000;
            auVar15._0_8_ = 0x4150000000000000;
            auVar14 = vmulpd_avx512vl(auVar14,auVar15);
            auVar15 = vcvttpd2uqq_avx512vl(auVar14);
            auVar16 = vcvtuqq2pd_avx512vl(auVar15);
            uVar3 = vcmppd_avx512vl(auVar14,auVar16,4);
            auVar14 = vcvtusi2sd_avx512f(in_XMM4,lVar8);
            lVar11 = vpextrq_avx(auVar15,1);
            uVar12 = 0;
            uVar7 = auVar15._0_8_ + (lVar8 << 0x2c) + lVar11 * 0x400000;
            if (dVar2 != auVar14._0_8_) {
              uVar7 = uVar12;
            }
            if (NAN(dVar2) || NAN(auVar14._0_8_)) {
              uVar7 = uVar12;
            }
            if ((uVar3 & 3) != 0) {
              uVar7 = uVar12;
            }
            pSVar13 = (Structure *)0x0;
            for (puVar9 = structureRanges; uVar10 = 0, puVar9 != DAT_004c0a20; puVar9 = puVar9 + 3)
            {
              uVar10 = uVar7 - puVar9[2];
              if (((ulong)puVar9[2] <= uVar7) && (uVar7 < (ulong)puVar9[1])) {
                pSVar13 = (Structure *)*puVar9;
                break;
              }
            }
          }
        }
      }
    }
  }
  pVar18.second = uVar10;
  pVar18.first = pSVar13;
  return pVar18;
}

Assistant:

std::pair<Structure*, size_t> evaluatePickQuery(int xPos, int yPos) {

  // NOTE: hack used for debugging: if xPos == yPos == 1 we do a pick render but do not query the value.

  // Be sure not to pick outside of buffer
  if (xPos < -1 || xPos >= view::bufferWidth || yPos < -1 || yPos >= view::bufferHeight) {
    return {nullptr, 0};
  }

  render::FrameBuffer* pickFramebuffer = render::engine->pickFramebuffer.get();

  render::engine->setDepthMode();
  render::engine->setBlendMode(BlendMode::Disable);

  pickFramebuffer->resize(view::bufferWidth, view::bufferHeight);
  pickFramebuffer->setViewport(0, 0, view::bufferWidth, view::bufferHeight);
  pickFramebuffer->clearColor = glm::vec3{0., 0., 0.};
  if (!pickFramebuffer->bindForRendering()) return {nullptr, 0};
  pickFramebuffer->clear();

  // Render pick buffer
  for (auto cat : state::structures) {
    for (auto x : cat.second) {
      x.second->drawPick();
    }
  }

  if (xPos == -1 || yPos == -1) {
    return {nullptr, 0};
  }

  // Read from the pick buffer
  std::array<float, 4> result = pickFramebuffer->readFloat4(xPos, view::bufferHeight - yPos);
  size_t globalInd = pick::vecToInd(glm::vec3{result[0], result[1], result[2]});

  return pick::globalIndexToLocal(globalInd);
}